

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double f_sample(int m,int n,int *seed)

{
  double dVar1;
  double dVar2;
  
  dVar1 = chi_square_sample((double)m,seed);
  dVar2 = chi_square_sample((double)n,seed);
  return (dVar1 * (double)n) / (dVar2 * (double)m);
}

Assistant:

double f_sample ( int m, int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    F_SAMPLE samples the F central PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double F_SAMPLE, a sample of the PDF.
//
{
  double a;
  double x;
  double xm;
  double xn;

  a = static_cast<double>(m );
  xm = chi_square_sample ( a, seed );

  a = static_cast<double>(n );
  xn = chi_square_sample ( a, seed );

  x = static_cast<double>(n ) * xm / ( static_cast<double>(m ) * xn );

  return x;
}